

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.hpp
# Opt level: O2

bool __thiscall
unodb::
db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
::remove_internal(db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                  *this,art_key_type k)

{
  __extent_storage<18446744073709551615UL> *this_00;
  basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> shifted_key;
  byte bVar1;
  bool bVar2;
  uint uVar3;
  pointer pbVar4;
  basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>
  *root_leaf;
  basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>
  *this_01;
  key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
  *this_02;
  optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*> oVar5;
  undefined1 auStack_68 [8];
  art_key_type k_local;
  art_key_type remaining_key;
  _Storage<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true> local_40;
  node_ptr *node;
  
  pbVar4 = k.field_0._8_8_;
  auStack_68 = k.field_0._0_8_;
  this_01 = (basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>
             *)(this->root).tagged_ptr;
  if (this_01 !=
      (basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header> *)
      0x0) {
    k_local.field_0.key._M_ptr = pbVar4;
    if (((ulong)this_01 & 7) == 0) {
      bVar2 = detail::
              basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>
              ::matches(this_01,(art_key_type)k.field_0);
      if (bVar2) {
        (this->root).tagged_ptr = 0;
        k_local.field_0.key._M_extent._M_extent_value =
             (__extent_storage<18446744073709551615UL>)this;
        std::
        unique_ptr<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
        ::~unique_ptr((unique_ptr<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                       *)&k_local.field_0.key._M_extent);
        return true;
      }
    }
    else {
      this_00 = &k_local.field_0.key._M_extent;
      k_local.field_0.key._M_extent._M_extent_value =
           (__extent_storage<18446744073709551615UL>)auStack_68;
      local_40 = (_Storage<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true>)this;
      while( true ) {
        if (((ulong)this_01 & 7) == 0) {
          __assert_fail("node_type != node_type::LEAF",
                        "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art.hpp"
                        ,0x3f9,
                        "bool unodb::db<std::span<const std::byte>, std::span<const std::byte>>::remove_internal(art_key_type) [Key = std::span<const std::byte>, Value = std::span<const std::byte>]"
                       );
        }
        this_02 = (key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
                   *)((ulong)this_01 & 0xfffffffffffffff8);
        bVar1 = detail::
                key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
                ::length(this_02);
        shifted_key.field_0.key._M_extent._M_extent_value =
             (__extent_storage<18446744073709551615UL>)
             (__extent_storage<18446744073709551615UL>)pbVar4;
        shifted_key.field_0.key._M_ptr = (pointer)k_local.field_0.key._M_extent._M_extent_value;
        uVar3 = detail::
                key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
                ::get_shared_length(this_02,shifted_key);
        if (uVar3 < bVar1) break;
        if (uVar3 != bVar1) {
          __assert_fail("shared_prefix_len == key_prefix_length",
                        "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art.hpp"
                        ,0x401,
                        "bool unodb::db<std::span<const std::byte>, std::span<const std::byte>>::remove_internal(art_key_type) [Key = std::span<const std::byte>, Value = std::span<const std::byte>]"
                       );
        }
        detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>::shift_right
                  ((basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *)this_00,
                   (ulong)bVar1);
        node._7_1_ = *(undefined1 *)k_local.field_0.key._M_extent._M_extent_value;
        oVar5 = detail::
                basic_inode_impl<unodb::detail::basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>>
                ::
                remove_or_choose_subtree<std::optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>*>,std::byte,unodb::detail::basic_art_key<std::span<std::byte_const,18446744073709551615ul>>&,unodb::db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>&,unodb::detail::basic_node_ptr<unodb::detail::node_header>*&>
                          ((basic_inode_impl<unodb::detail::basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>>
                            *)this_02,(node_type)this_01 & (I256|I48),(byte *)((long)&node + 7),
                           (basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *)
                           auStack_68,this,&local_40._M_value);
        local_40 = oVar5.
                   super__Optional_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true>
                   ._M_payload.
                   super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>
                   ._M_payload;
        if (((undefined1  [16])
             oVar5.
             super__Optional_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true>
             ._M_payload.
             super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>
            & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
        if ((db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
             *)local_40._M_value ==
            (db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
             *)0x0) {
          return true;
        }
        detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>::shift_right
                  ((basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *)this_00,1);
        this_01 = (basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>
                   *)((node_ptr *)&(local_40._M_value)->tagged_ptr)->tagged_ptr;
      }
    }
  }
  return false;
}

Assistant:

bool db<Key, Value>::remove_internal(art_key_type k) {
  if (UNODB_DETAIL_UNLIKELY(root == nullptr)) return false;

  if (root.type() == node_type::LEAF) {
    auto* const root_leaf{root.ptr<leaf_type*>()};
    if (root_leaf->matches(k)) {
      const auto r{art_policy::reclaim_leaf_on_scope_exit(root_leaf, *this)};
      root = nullptr;
      return true;
    }
    return false;
  }

  auto* node = &root;
  tree_depth_type depth{};
  auto remaining_key{k};

  while (true) {
    const auto node_type = node->type();
    UNODB_DETAIL_ASSERT(node_type != node_type::LEAF);

    auto* const inode{node->template ptr<inode_type*>()};
    const auto& key_prefix{inode->get_key_prefix()};
    const auto key_prefix_length{key_prefix.length()};
    const auto shared_prefix_len{key_prefix.get_shared_length(remaining_key)};
    if (shared_prefix_len < key_prefix_length) return false;

    UNODB_DETAIL_ASSERT(shared_prefix_len == key_prefix_length);
    depth += key_prefix_length;
    remaining_key.shift_right(key_prefix_length);

    const auto remove_result{inode->template remove_or_choose_subtree<
        std::optional<detail::node_ptr*>>(node_type, remaining_key[0], k, *this,
                                          node)};
    if (UNODB_DETAIL_UNLIKELY(!remove_result)) return false;

    auto* const child_ptr{*remove_result};
    if (child_ptr == nullptr) return true;

    node = child_ptr;
    ++depth;
    remaining_key.shift_right(1);
  }
}